

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

size_t __thiscall PicHeader::binSize(PicHeader *this)

{
  byte *in_RDI;
  PicHeader *unaff_retaddr;
  PicHeader *in_stack_00000010;
  undefined8 local_8;
  
  if ((*in_RDI & 1) == 0) {
    local_8 = picBinSize<PicHeaderPS3>(unaff_retaddr);
  }
  else {
    local_8 = picBinSize<PicHeaderSwitch>(in_stack_00000010);
  }
  return local_8;
}

Assistant:

size_t PicHeader::binSize() const {
	if (isSwitch) {
		return picBinSize<PicHeaderSwitch>(this);
	} else {
		return picBinSize<PicHeaderPS3>(this);
	}
}